

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

int fits_img_stats_int(int *array,long nx,long ny,int nullcheck,int nullvalue,long *ngoodpix,
                      int *minvalue,int *maxvalue,double *mean,double *sigma,double *noise1,
                      double *noise2,double *noise3,double *noise5,int *status)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long ii;
  ulong uVar9;
  void *__ptr;
  double *pdVar10;
  ulong uVar11;
  double *arr;
  double *arr_00;
  double *__ptr_00;
  double *__base;
  double *__base_00;
  size_t sVar12;
  size_t sVar13;
  LONGLONG LVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  int *piVar18;
  int *piVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  size_t __nmemb;
  size_t sVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  size_t __nmemb_00;
  ulong uVar31;
  bool bVar32;
  double dVar33;
  double dVar34;
  size_t local_e8;
  double dStack_c0;
  uint local_94;
  size_t local_90;
  long local_88;
  uint local_80;
  uint local_7c;
  long local_78;
  size_t local_70;
  uint local_60;
  uint local_5c;
  
  uVar22 = nx;
  if (mean != (double *)0x0 || sigma != (double *)0x0) {
    uVar9 = ny * nx;
    if (nullcheck == 0) {
      if ((long)uVar9 < 1) goto LAB_001b7ce8;
      dVar33 = 0.0;
      lVar25 = 0;
      dVar34 = 0.0;
      do {
        dVar4 = (double)array[lVar25];
        dVar34 = dVar34 + dVar4;
        dVar33 = dVar33 + dVar4 * dVar4;
        lVar25 = lVar25 + 1;
        uVar22 = uVar9;
      } while (uVar9 - lVar25 != 0);
    }
    else if ((long)uVar9 < 1) {
      uVar9 = 0;
LAB_001b7ce8:
      dVar34 = 0.0;
      dVar33 = 0.0;
      uVar22 = uVar9;
    }
    else {
      dVar33 = 0.0;
      uVar22 = 0;
      dVar34 = 0.0;
      lVar25 = 0;
      do {
        if (array[lVar25] != nullvalue) {
          dVar4 = (double)array[lVar25];
          uVar22 = uVar22 + 1;
          dVar34 = dVar34 + dVar4;
          dVar33 = dVar33 + dVar4 * dVar4;
        }
        lVar25 = lVar25 + 1;
      } while (uVar9 - lVar25 != 0);
    }
    if ((long)uVar22 < 2) {
      dVar33 = 0.0;
      bVar32 = uVar22 == 1;
      uVar22 = (ulong)bVar32;
      if (!bVar32) {
        dVar34 = 0.0;
      }
    }
    else {
      dVar34 = dVar34 / (double)(long)uVar22;
      dVar33 = dVar33 / (double)(long)uVar22 - dVar34 * dVar34;
      if (dVar33 < 0.0) {
        dVar33 = sqrt(dVar33);
      }
      else {
        dVar33 = SQRT(dVar33);
      }
    }
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = uVar22;
    }
    if (mean != (double *)0x0) {
      *mean = dVar34;
    }
    if (sigma != (double *)0x0) {
      *sigma = dVar33;
    }
  }
  if (noise1 != (double *)0x0) {
    dVar33 = 0.0;
    if (2 < nx) {
      __ptr = calloc(nx,4);
      if (__ptr != (void *)0x0) {
        pdVar10 = (double *)calloc(ny,8);
        if (pdVar10 != (double *)0x0) {
          if (ny < 1) {
            local_e8 = 0;
          }
          else {
            local_e8 = 0;
            lVar25 = 0;
            piVar19 = array;
            do {
              lVar17 = 0;
              lVar15 = lVar17;
              if (nullcheck != 0) {
                do {
                  lVar15 = lVar17;
                  if (piVar19[lVar17] != nullvalue) break;
                  lVar17 = lVar17 + 1;
                  lVar15 = nx;
                } while (nx != lVar17);
              }
              if (lVar15 != nx) {
                lVar17 = lVar15 + 1;
                if (lVar17 < nx) {
                  piVar18 = array + lVar25 * nx + lVar15;
                  uVar9 = 0;
                  do {
                    lVar15 = lVar17;
                    if ((nullcheck != 0) && (lVar17 < nx)) {
                      do {
                        lVar15 = lVar17;
                        if (piVar19[lVar17] != nullvalue) break;
                        lVar17 = lVar17 + 1;
                        lVar15 = nx;
                      } while (nx != lVar17);
                    }
                    if (lVar15 == nx) break;
                    iVar30 = *piVar18;
                    piVar18 = array + lVar25 * nx + lVar15;
                    *(int *)((long)__ptr + uVar9 * 4) = iVar30 - *piVar18;
                    uVar9 = uVar9 + 1;
                    lVar17 = lVar15 + 1;
                  } while (lVar17 < nx);
                }
                else {
                  uVar9 = 0;
                }
                if (1 < uVar9) {
                  dVar33 = 0.0;
                  dVar34 = 0.0;
                  uVar11 = 0;
                  do {
                    dVar4 = (double)*(int *)((long)__ptr + uVar11 * 4);
                    dVar34 = dVar34 + dVar4;
                    dVar33 = dVar33 + dVar4 * dVar4;
                    uVar11 = uVar11 + 1;
                  } while (uVar9 != uVar11);
                  dVar34 = dVar34 / (double)(long)uVar9;
                  dVar33 = dVar33 / (double)(long)uVar9 - dVar34 * dVar34;
                  if (dVar33 < 0.0) {
                    dVar33 = sqrt(dVar33);
                  }
                  else {
                    dVar33 = SQRT(dVar33);
                  }
                  if (0.0 < dVar33) {
                    iVar30 = 0;
                    do {
                      if ((long)uVar9 < 1) {
                        uVar31 = 0;
                      }
                      else {
                        uVar11 = 0;
                        uVar31 = 0;
                        do {
                          iVar1 = *(int *)((long)__ptr + uVar11 * 4);
                          if (ABS((double)iVar1 - dVar34) < dVar33 * 5.0) {
                            if ((long)uVar31 < (long)uVar11) {
                              *(int *)((long)__ptr + uVar31 * 4) = iVar1;
                            }
                            uVar31 = uVar31 + 1;
                          }
                          uVar11 = uVar11 + 1;
                        } while (uVar9 != uVar11);
                      }
                      if (uVar31 == uVar9) break;
                      if ((long)uVar31 < 1) {
                        dVar34 = 0.0;
                        dVar33 = 0.0;
                      }
                      else {
                        dVar33 = 0.0;
                        dVar34 = 0.0;
                        uVar9 = 0;
                        do {
                          dVar4 = (double)*(int *)((long)__ptr + uVar9 * 4);
                          dVar34 = dVar34 + dVar4;
                          dVar33 = dVar33 + dVar4 * dVar4;
                          uVar9 = uVar9 + 1;
                        } while (uVar31 != uVar9);
                      }
                      if ((long)uVar31 < 2) {
                        dVar33 = 0.0;
                        if (uVar31 != 1) {
                          dVar34 = 0.0;
                        }
                      }
                      else {
                        dVar34 = dVar34 / (double)(long)uVar31;
                        dVar33 = dVar33 / (double)(long)uVar31 - dVar34 * dVar34;
                        if (dVar33 < 0.0) {
                          dVar33 = sqrt(dVar33);
                        }
                        else {
                          dVar33 = SQRT(dVar33);
                        }
                      }
                      iVar30 = iVar30 + 1;
                      uVar9 = uVar31;
                    } while (iVar30 != 3);
                  }
                  pdVar10[local_e8] = dVar33;
                  local_e8 = local_e8 + 1;
                }
              }
              lVar25 = lVar25 + 1;
              piVar19 = piVar19 + nx;
            } while (lVar25 != ny);
          }
          if (local_e8 == 0) {
            dVar33 = 0.0;
          }
          else if (local_e8 == 1) {
            dVar33 = *pdVar10;
          }
          else {
            qsort(pdVar10,local_e8,8,FnCompare_double);
            dVar33 = (*(double *)
                       ((long)pdVar10 +
                       ((local_e8 - ((long)(local_e8 - 1) >> 0x3f)) - 1 & 0xfffffffffffffffe) * 4) +
                     *(double *)
                      ((long)pdVar10 +
                      (local_e8 - ((long)local_e8 >> 0x3f) & 0xfffffffffffffffe) * 4)) * 0.5;
          }
          dVar33 = dVar33 * 0.70710678;
          free(pdVar10);
          free(__ptr);
          goto LAB_001b819c;
        }
        free(__ptr);
      }
      *status = 0x71;
      dVar33 = 0.0;
    }
LAB_001b819c:
    *noise1 = dVar33;
  }
  if ((minvalue == (int *)0x0 && maxvalue == (int *)0x0) && noise3 == (double *)0x0)
  goto LAB_001b89a6;
  lVar25 = 1;
  __nmemb = ny;
  if (nx < 9) {
    __nmemb = 1;
    lVar25 = ny;
  }
  __nmemb_00 = lVar25 * nx;
  if ((long)__nmemb_00 < 9) {
    dVar33 = 0.0;
    dStack_c0 = 0.0;
    dVar34 = 0.0;
    if ((long)__nmemb_00 < 1) {
      uVar29 = 0x80000000;
      uVar20 = 0x7fffffff;
      uVar22 = 0;
      dVar34 = 0.0;
    }
    else {
      uVar20 = 0x7fffffff;
      uVar29 = 0x80000000;
      lVar25 = 0;
      uVar22 = 0;
      do {
        if ((nullcheck == 0) || (array[lVar25] != nullvalue)) {
          uVar21 = array[lVar25];
          if ((int)uVar21 < (int)uVar20) {
            uVar20 = uVar21;
          }
          if ((int)uVar29 < (int)uVar21) {
            uVar29 = uVar21;
          }
          uVar22 = uVar22 + 1;
        }
        lVar25 = lVar25 + 1;
      } while (__nmemb_00 - lVar25 != 0);
    }
  }
  else {
    pdVar10 = (double *)calloc(__nmemb_00,8);
    if (pdVar10 != (double *)0x0) {
      arr = (double *)calloc(__nmemb_00,8);
      if (arr != (double *)0x0) {
        arr_00 = (double *)calloc(__nmemb_00,8);
        if (arr_00 == (double *)0x0) {
          free(pdVar10);
          pdVar10 = arr;
        }
        else {
          __ptr_00 = (double *)calloc(__nmemb,8);
          if (__ptr_00 == (double *)0x0) {
            free(pdVar10);
            free(arr);
            pdVar10 = arr_00;
          }
          else {
            __base = (double *)calloc(__nmemb,8);
            if (__base == (double *)0x0) {
              free(pdVar10);
              free(arr);
              free(arr_00);
              pdVar10 = __ptr_00;
            }
            else {
              __base_00 = (double *)calloc(__nmemb,8);
              if (__base_00 != (double *)0x0) {
                if ((long)__nmemb < 1) {
                  uVar29 = 0x80000000;
                  uVar20 = 0x7fffffff;
                  uVar22 = 0;
                  local_90 = 0;
                  local_70 = 0;
                }
                else {
                  uVar21 = 0x7fffffff;
                  uVar20 = 0x7fffffff;
                  uVar23 = 0x80000000;
                  uVar29 = 0x80000000;
                  sVar27 = 0;
                  local_70 = 0;
                  local_90 = 0;
                  uVar22 = 0;
                  piVar19 = array;
                  do {
                    sVar12 = 0;
                    sVar13 = sVar12;
                    if (nullcheck != 0) {
                      do {
                        sVar13 = sVar12;
                        if (piVar19[sVar12] != nullvalue) break;
                        sVar12 = sVar12 + 1;
                        sVar13 = __nmemb_00;
                      } while (__nmemb_00 - sVar12 != 0);
                    }
                    if (sVar13 != __nmemb_00) {
                      lVar15 = sVar27 * __nmemb_00;
                      uVar16 = array[lVar15 + sVar13];
                      bVar32 = (int)uVar16 < (int)uVar20;
                      uVar20 = uVar21;
                      if (bVar32) {
                        uVar20 = uVar16;
                      }
                      bVar32 = (int)uVar29 < (int)uVar16;
                      uVar29 = uVar23;
                      if (bVar32) {
                        uVar29 = uVar16;
                      }
                      sVar13 = sVar13 + 1;
                      sVar12 = sVar13;
                      if ((nullcheck != 0) && ((long)sVar13 < (long)__nmemb_00)) {
                        do {
                          sVar12 = sVar13;
                          if (piVar19[sVar13] != nullvalue) break;
                          sVar13 = sVar13 + 1;
                          sVar12 = __nmemb_00;
                        } while (__nmemb_00 - sVar13 != 0);
                      }
                      if (sVar12 == __nmemb_00) {
                        uVar22 = uVar22 + 1;
                        uVar21 = uVar20;
                        uVar23 = uVar29;
                      }
                      else {
                        uVar21 = array[lVar15 + sVar12];
                        if ((int)uVar21 < (int)uVar20) {
                          uVar20 = uVar21;
                        }
                        if ((int)uVar29 < (int)uVar21) {
                          uVar29 = uVar21;
                        }
                        sVar12 = sVar12 + 1;
                        sVar13 = sVar12;
                        if ((nullcheck != 0) && ((long)sVar12 < (long)__nmemb_00)) {
                          do {
                            sVar13 = sVar12;
                            if (piVar19[sVar12] != nullvalue) break;
                            sVar12 = sVar12 + 1;
                            sVar13 = __nmemb_00;
                          } while (__nmemb_00 - sVar12 != 0);
                        }
                        if (sVar13 == __nmemb_00) {
                          uVar22 = uVar22 + 2;
                          uVar21 = uVar20;
                          uVar23 = uVar29;
                        }
                        else {
                          uVar23 = array[lVar15 + sVar13];
                          if ((int)uVar23 < (int)uVar20) {
                            uVar20 = uVar23;
                          }
                          if ((int)uVar29 < (int)uVar23) {
                            uVar29 = uVar23;
                          }
                          sVar13 = sVar13 + 1;
                          sVar12 = sVar13;
                          if ((nullcheck != 0) && ((long)sVar13 < (long)__nmemb_00)) {
                            do {
                              sVar12 = sVar13;
                              if (piVar19[sVar13] != nullvalue) break;
                              sVar13 = sVar13 + 1;
                              sVar12 = __nmemb_00;
                            } while (__nmemb_00 - sVar13 != 0);
                          }
                          if (sVar12 == __nmemb_00) {
                            uVar22 = uVar22 + 3;
                            uVar21 = uVar20;
                            uVar23 = uVar29;
                          }
                          else {
                            local_94 = array[lVar15 + sVar12];
                            if ((int)local_94 < (int)uVar20) {
                              uVar20 = local_94;
                            }
                            if ((int)uVar29 < (int)local_94) {
                              uVar29 = local_94;
                            }
                            sVar12 = sVar12 + 1;
                            sVar13 = sVar12;
                            if ((nullcheck != 0) && ((long)sVar12 < (long)__nmemb_00)) {
                              do {
                                sVar13 = sVar12;
                                if (piVar19[sVar12] != nullvalue) break;
                                sVar12 = sVar12 + 1;
                                sVar13 = __nmemb_00;
                              } while (__nmemb_00 - sVar12 != 0);
                            }
                            if (sVar13 == __nmemb_00) {
                              uVar22 = uVar22 + 4;
                              uVar21 = uVar20;
                              uVar23 = uVar29;
                            }
                            else {
                              local_5c = array[lVar15 + sVar13];
                              if ((int)local_5c < (int)uVar20) {
                                uVar20 = local_5c;
                              }
                              if ((int)uVar29 < (int)local_5c) {
                                uVar29 = local_5c;
                              }
                              sVar13 = sVar13 + 1;
                              sVar12 = sVar13;
                              if ((nullcheck != 0) && ((long)sVar13 < (long)__nmemb_00)) {
                                do {
                                  sVar12 = sVar13;
                                  if (piVar19[sVar13] != nullvalue) break;
                                  sVar13 = sVar13 + 1;
                                  sVar12 = __nmemb_00;
                                } while (__nmemb_00 - sVar13 != 0);
                              }
                              if (sVar12 == __nmemb_00) {
                                uVar22 = uVar22 + 5;
                                uVar21 = uVar20;
                                uVar23 = uVar29;
                              }
                              else {
                                local_7c = array[lVar15 + sVar12];
                                if ((int)local_7c < (int)uVar20) {
                                  uVar20 = local_7c;
                                }
                                if ((int)uVar29 < (int)local_7c) {
                                  uVar29 = local_7c;
                                }
                                sVar12 = sVar12 + 1;
                                sVar13 = sVar12;
                                if ((nullcheck != 0) && ((long)sVar12 < (long)__nmemb_00)) {
                                  do {
                                    sVar13 = sVar12;
                                    if (piVar19[sVar12] != nullvalue) break;
                                    sVar12 = sVar12 + 1;
                                    sVar13 = __nmemb_00;
                                  } while (__nmemb_00 - sVar12 != 0);
                                }
                                if (sVar13 == __nmemb_00) {
                                  uVar22 = uVar22 + 6;
                                  uVar21 = uVar20;
                                  uVar23 = uVar29;
                                }
                                else {
                                  local_60 = array[lVar15 + sVar13];
                                  if ((int)local_60 < (int)uVar20) {
                                    uVar20 = local_60;
                                  }
                                  if ((int)uVar29 < (int)local_60) {
                                    uVar29 = local_60;
                                  }
                                  sVar13 = sVar13 + 1;
                                  sVar12 = sVar13;
                                  if ((nullcheck != 0) && ((long)sVar13 < (long)__nmemb_00)) {
                                    do {
                                      sVar12 = sVar13;
                                      if (piVar19[sVar13] != nullvalue) break;
                                      sVar13 = sVar13 + 1;
                                      sVar12 = __nmemb_00;
                                    } while (__nmemb_00 - sVar13 != 0);
                                  }
                                  if (sVar12 == __nmemb_00) {
                                    uVar22 = uVar22 + 7;
                                    uVar21 = uVar20;
                                    uVar23 = uVar29;
                                  }
                                  else {
                                    local_80 = array[lVar15 + sVar12];
                                    lVar17 = uVar22 + 8;
                                    if ((int)local_80 < (int)uVar20) {
                                      uVar20 = local_80;
                                    }
                                    if ((int)uVar29 < (int)local_80) {
                                      uVar29 = local_80;
                                    }
                                    sVar12 = sVar12 + 1;
                                    if ((long)sVar12 < (long)__nmemb_00) {
                                      local_88 = 0;
                                      local_78 = 0;
                                      do {
                                        uVar8 = local_5c;
                                        uVar7 = local_60;
                                        uVar6 = local_7c;
                                        uVar5 = local_94;
                                        local_94 = local_5c;
                                        local_7c = local_60;
                                        sVar13 = sVar12;
                                        if ((nullcheck != 0) && ((long)sVar12 < (long)__nmemb_00)) {
                                          do {
                                            sVar13 = sVar12;
                                            if (piVar19[sVar12] != nullvalue) break;
                                            sVar12 = sVar12 + 1;
                                            sVar13 = __nmemb_00;
                                          } while (__nmemb_00 - sVar12 != 0);
                                        }
                                        if (sVar13 == __nmemb_00) break;
                                        local_60 = local_80;
                                        local_80 = array[lVar15 + sVar13];
                                        if ((int)local_80 < (int)uVar20) {
                                          uVar20 = local_80;
                                        }
                                        if ((int)uVar29 < (int)local_80) {
                                          uVar29 = local_80;
                                        }
                                        uVar24 = local_5c ^ uVar6;
                                        local_5c = uVar6;
                                        lVar26 = (long)(int)uVar8;
                                        if (uVar24 != 0 || (uVar6 ^ uVar7) != 0) {
                                          uVar9 = lVar26 - (int)uVar7;
                                          uVar22 = -uVar9;
                                          if (0 < (long)uVar9) {
                                            uVar22 = uVar9;
                                          }
                                          pdVar10[local_78] = (double)(uVar22 & 0xffffffff);
                                          local_78 = local_78 + 1;
                                        }
                                        if ((uVar24 == 0 && (uVar5 == uVar8 && uVar23 == uVar5)) &&
                                            (uVar6 ^ uVar7) == 0) {
                                          lVar17 = lVar17 + 1;
                                        }
                                        else {
                                          lVar28 = (long)(int)uVar23 + (long)(int)uVar7;
                                          dVar34 = (double)(lVar26 * 2 - lVar28);
                                          dVar33 = (double)-(long)dVar34;
                                          if (0 < (long)dVar34) {
                                            dVar33 = dVar34;
                                          }
                                          arr[local_88] = dVar33;
                                          dVar34 = (double)((long)(int)uVar16 + lVar26 * 6 +
                                                            lVar28 * -4 + (long)(int)local_80);
                                          dVar33 = (double)-(long)dVar34;
                                          if (0 < (long)dVar34) {
                                            dVar33 = dVar34;
                                          }
                                          arr_00[local_88] = dVar33;
                                          local_88 = local_88 + 1;
                                        }
                                        sVar12 = sVar13 + 1;
                                        uVar16 = uVar21;
                                        uVar21 = uVar23;
                                        uVar23 = uVar5;
                                      } while ((long)sVar12 < (long)__nmemb_00);
                                    }
                                    else {
                                      local_78 = 0;
                                      local_88 = 0;
                                    }
                                    uVar22 = lVar17 + local_88;
                                    uVar21 = uVar20;
                                    uVar23 = uVar29;
                                    if (local_88 != 0) {
                                      if (local_88 == 1) {
                                        if (local_78 == 1) {
                                          __ptr_00[local_90] = (double)(long)*pdVar10;
                                          local_90 = local_90 + 1;
                                        }
                                        __base[local_70] = (double)(long)*arr;
                                        dVar33 = *arr_00;
                                      }
                                      else {
                                        iVar30 = (int)local_88;
                                        if (1 < local_78) {
                                          LVar14 = quick_select_longlong((LONGLONG *)pdVar10,iVar30)
                                          ;
                                          __ptr_00[local_90] = (double)LVar14;
                                          local_90 = local_90 + 1;
                                        }
                                        LVar14 = quick_select_longlong((LONGLONG *)arr,iVar30);
                                        __base[local_70] = (double)LVar14;
                                        dVar33 = (double)quick_select_longlong
                                                                   ((LONGLONG *)arr_00,iVar30);
                                      }
                                      __base_00[local_70] = (double)(long)dVar33;
                                      local_70 = local_70 + 1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    sVar27 = sVar27 + 1;
                    piVar19 = piVar19 + lVar25 * nx;
                  } while (sVar27 != __nmemb);
                }
                if (local_70 == 0) {
                  dVar33 = 0.0;
                  dStack_c0 = 0.0;
                }
                else if (local_70 == 1) {
                  dVar33 = *__base;
                  dStack_c0 = *__base_00;
                }
                else {
                  qsort(__base,local_70,8,FnCompare_double);
                  qsort(__base_00,local_70,8,FnCompare_double);
                  lVar25 = ((local_70 - ((long)(local_70 - 1) >> 0x3f)) - 1 & 0x3ffffffffffffffe) *
                           4;
                  lVar15 = (local_70 - ((long)local_70 >> 0x3f) & 0x3ffffffffffffffe) * 4;
                  dVar33 = (*(double *)((long)__base + lVar15) + *(double *)((long)__base + lVar25))
                           * 0.5;
                  dStack_c0 = (*(double *)((long)__base_00 + lVar15) +
                              *(double *)((long)__base_00 + lVar25)) * 0.5;
                }
                if (local_90 == 0) {
                  dVar34 = 0.0;
                }
                else if (local_90 == 1) {
                  dVar34 = *__ptr_00;
                }
                else {
                  auVar3._8_4_ = SUB84(dStack_c0,0);
                  auVar3._0_8_ = dVar33;
                  auVar3._12_4_ = (int)((ulong)dStack_c0 >> 0x20);
                  qsort(__ptr_00,local_90,8,FnCompare_double);
                  dStack_c0 = auVar3._8_8_;
                  dVar34 = (*(double *)
                             ((long)__ptr_00 +
                             ((local_90 - ((long)(local_90 - 1) >> 0x3f)) - 1 & 0xfffffffffffffffe)
                             * 4) + *(double *)
                                     ((long)__ptr_00 +
                                     (local_90 - ((long)local_90 >> 0x3f) & 0xfffffffffffffffe) * 4)
                           ) * 0.5;
                }
                dVar34 = dVar34 * 1.0483579;
                dVar33 = dVar33 * 0.6052697;
                auVar2._8_4_ = SUB84(dStack_c0 * 0.1772048,0);
                auVar2._0_8_ = dVar33;
                auVar2._12_4_ = (int)((ulong)(dStack_c0 * 0.1772048) >> 0x20);
                free(__base_00);
                free(__base);
                free(__ptr_00);
                free(arr_00);
                free(arr);
                free(pdVar10);
                dStack_c0 = auVar2._8_8_;
                goto LAB_001b8963;
              }
              free(pdVar10);
              free(arr);
              free(arr_00);
              free(__ptr_00);
              pdVar10 = __base;
            }
          }
        }
      }
      free(pdVar10);
    }
    *status = 0x71;
    dVar33 = 0.0;
    dStack_c0 = 0.0;
    dVar34 = 0.0;
    uVar20 = 0;
    uVar29 = 0;
  }
LAB_001b8963:
  if (ngoodpix != (long *)0x0) {
    *ngoodpix = uVar22;
  }
  if (minvalue != (int *)0x0) {
    *minvalue = uVar20;
  }
  if (maxvalue != (int *)0x0) {
    *maxvalue = uVar29;
  }
  if (noise2 != (double *)0x0) {
    *noise2 = dVar34;
  }
  if (noise3 != (double *)0x0) {
    *noise3 = dVar33;
  }
  if (noise5 != (double *)0x0) {
    *noise5 = dStack_c0;
  }
LAB_001b89a6:
  return *status;
}

Assistant:

int fits_img_stats_int(int *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	int nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	int *minvalue,    /* returned minimum non-null value in the array */
	int *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input integer image.
*/
{
	long ngood;
	int minval = 0, maxval = 0;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_int(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_int(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_int(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}